

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall phosg::Image::save(Image *this,FILE *f,Format format)

{
  undefined1 *puVar1;
  void *pvVar2;
  long lVar3;
  uint uVar4;
  ssize_t x;
  size_t size;
  long lVar5;
  runtime_error *prVar6;
  char *__format;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  anon_class_8_1_54a39806 local_188;
  unique_ptr<void,_void_(*)(void_*)> row_data_unique;
  uint8_t row_padding_data [4];
  _Head_base<0UL,_void_*,_false> local_168;
  uLongf idat_size;
  be_uint32_t gAMA;
  uint8_t SIG [8];
  anon_struct_13_7_88857fac IHDR;
  char header [256];
  
  local_188.f = f;
  switch(format) {
  case GRAYSCALE_PPM:
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"can\'t save grayscale ppm files");
    break;
  case COLOR_PPM:
    __format = "P6 %zu %zu %lu\n";
    if (this->has_alpha != false) {
      __format = "P7\nWIDTH %zu\nHEIGHT %zu\nDEPTH 4\nMAXVAL %lu\nTUPLTYPE RGB_ALPHA\nENDHDR\n";
    }
    snprintf(header,0x100,__format,this->width,this->height,this->max_value);
    size = strlen(header);
    fwritex(f,header,size);
    pvVar2 = (this->data).raw;
    sVar8 = get_data_size(this);
    fwritex(f,pvVar2,sVar8);
    return;
  case WINDOWS_BITMAP:
    if (this->channel_width == '\b') {
      sVar8 = (ulong)this->has_alpha + 3;
      uVar7 = (ulong)(-((int)sVar8 * (int)this->width) & 3);
      row_padding_data[0] = '\0';
      row_padding_data[1] = '\0';
      row_padding_data[2] = '\0';
      row_padding_data[3] = '\0';
      sVar8 = init_bmp_header((WindowsBitmapHeader *)header,this->width,this->height,this->has_alpha
                              ,sVar8,uVar7);
      fwritex(f,(WindowsBitmapHeader *)header,sVar8);
      if (this->has_alpha == true) {
        lVar9 = this->height;
        lVar10 = lVar9 * 4;
        for (; lVar10 = lVar10 + -4, 0 < lVar9; lVar9 = lVar9 + -1) {
          fwritex(f,(void *)(lVar10 * this->width + (long)(this->data).raw),this->width << 2);
        }
        return;
      }
      malloc_unique((phosg *)&row_data_unique,this->width * 3);
      lVar10 = this->height;
      lVar9 = lVar10 * 3;
      while (lVar9 = lVar9 + -3, 0 < lVar10) {
        lVar10 = lVar10 + -1;
        lVar5 = 0;
        while( true ) {
          lVar3 = this->width;
          if (SBORROW8(lVar5,lVar3 * 3) == lVar5 + lVar3 * -3 < 0) break;
          *(undefined1 *)
           ((long)row_data_unique._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_void_*,_false>._M_head_impl + lVar5) =
               *(undefined1 *)((long)(this->data).raw + lVar5 + 2 + lVar3 * lVar9);
          *(undefined1 *)
           ((long)row_data_unique._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_void_*,_false>._M_head_impl + lVar5 + 1) =
               *(undefined1 *)((long)(this->data).raw + lVar5 + 1 + this->width * lVar9);
          *(undefined1 *)
           ((long)row_data_unique._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_void_*,_false>._M_head_impl + lVar5 + 2) =
               *(undefined1 *)((long)(this->data).raw + lVar5 + this->width * lVar9);
          lVar5 = lVar5 + 3;
        }
        fwritex(f,row_data_unique._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_void_*,_false>._M_head_impl,lVar3 * 3);
        if (uVar7 != 0) {
          fwritex(f,row_padding_data,uVar7);
        }
      }
LAB_0010f5ec:
      ::std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr(&row_data_unique);
      return;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"can\'t save bmp with more than 8-bit channels");
    break;
  case PNG:
    if (this->channel_width == '\b') {
      SIG[0] = 0x89;
      SIG[1] = 'P';
      SIG[2] = 'N';
      SIG[3] = 'G';
      SIG[4] = '\r';
      SIG[5] = '\n';
      SIG[6] = '\x1a';
      SIG[7] = '\n';
      fwritex(f,SIG,8);
      uVar4 = (uint)this->width;
      IHDR.width.super_reverse_endian<unsigned_int,_unsigned_int>.
      super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
      .value = (reverse_endian<unsigned_int,_unsigned_int>)
               (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
      uVar4 = (uint)this->height;
      IHDR.height.super_reverse_endian<unsigned_int,_unsigned_int>.
      super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
      .value = (reverse_endian<unsigned_int,_unsigned_int>)
               (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
      IHDR.bit_depth = '\b';
      IHDR.color_type = this->has_alpha << 2 | 2;
      IHDR.compression = '\0';
      IHDR.filter = '\0';
      IHDR.interlace = '\0';
      write_png_chunk<phosg::Image::save(_IO_FILE*,phosg::Image::Format)const::__0&>
                ((char (*) [5])"IHDR",&IHDR,(be_uint32_t)0xd000000,&local_188);
      gAMA.super_reverse_endian<unsigned_int,_unsigned_int>.
      super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
      .value = (reverse_endian<unsigned_int,_unsigned_int>)
               (converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                )0x8fb10000;
      write_png_chunk<phosg::Image::save(_IO_FILE*,phosg::Image::Format)const::__0&>
                ((char (*) [5])"gAMA",&gAMA,(be_uint32_t)0x4000000,&local_188);
      lVar10 = (ulong)this->has_alpha + 3;
      sVar8 = (this->width * lVar10 + 1) * this->height;
      malloc_unique((phosg *)&row_data_unique,sVar8);
      for (uVar4 = 0; uVar7 = (ulong)uVar4, uVar7 < (ulong)this->height; uVar4 = uVar4 + 1) {
        lVar9 = this->width;
        pvVar2 = (this->data).raw;
        puVar1 = (undefined1 *)
                 ((long)row_data_unique._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_void_*,_false>._M_head_impl +
                 (lVar9 * lVar10 + 1) * uVar7);
        *puVar1 = 0;
        memcpy(puVar1 + 1,(void *)(uVar7 * lVar10 * lVar9 + (long)pvVar2),this->width * lVar10);
      }
      idat_size = compressBound(sVar8);
      malloc_unique((phosg *)row_padding_data,idat_size);
      uVar4 = compress2(local_168._M_head_impl,&idat_size,
                        row_data_unique._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_void_*,_false>._M_head_impl,sVar8,9);
      if (uVar4 != 0) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        string_printf_abi_cxx11_
                  ((string *)header,"zlib error compressing png data: %d",(ulong)uVar4);
        ::std::runtime_error::runtime_error(prVar6,(string *)header);
        __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      write_png_chunk<phosg::Image::save(_IO_FILE*,phosg::Image::Format)const::__0&>
                ((char (*) [5])"IDAT",local_168._M_head_impl,
                 (be_uint32_t)
                 ((uint)idat_size >> 0x18 | ((uint)idat_size & 0xff0000) >> 8 |
                  ((uint)idat_size & 0xff00) << 8 | (uint)idat_size << 0x18),&local_188);
      write_png_chunk<phosg::Image::save(_IO_FILE*,phosg::Image::Format)const::__0&>
                ((char (*) [5])"IEND",(void *)0x0,(be_uint32_t)0x0,&local_188);
      ::std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr
                ((unique_ptr<void,_void_(*)(void_*)> *)row_padding_data);
      goto LAB_0010f5ec;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"can\'t save png with more than 8-bit channels");
    break;
  default:
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"unknown file format in Image::save()");
  }
  __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Image::save(FILE* f, Format format) const {
  this->save_helper(format, [f](const void* data, size_t size) {
    fwritex(f, data, size);
  });
}